

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_StoDeriveMatches(Nf_Man_t *p,int fVerbose)

{
  void *__ptr;
  int iVar1;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar2;
  Vec_Wrd_t *vStore;
  word *pwVar3;
  int *piVar4;
  Mio_Cell2_t *pMVar5;
  long lVar6;
  long lVar7;
  int nPerms [7];
  int *pPerm [7];
  int *pComp [7];
  int local_c8 [8];
  int *local_a8 [8];
  int *local_68 [7];
  
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pVVar2 = (Vec_Int_t *)calloc(1000,0x10);
  p_00->pArray = pVVar2;
  vStore = (Vec_Wrd_t *)malloc(0x10);
  vStore->nCap = 10000;
  vStore->nSize = 0;
  pwVar3 = (word *)malloc(80000);
  vStore->pArray = pwVar3;
  Vec_WecPushLevel(p_00);
  Vec_WecPushLevel(p_00);
  lVar6 = 1;
  do {
    piVar4 = Extra_GreyCodeSchedule((int)lVar6);
    local_68[lVar6] = piVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  lVar6 = 1;
  do {
    piVar4 = Extra_PermSchedule((int)lVar6);
    local_a8[lVar6] = piVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  lVar6 = 1;
  do {
    iVar1 = Extra_Factorial((int)lVar6);
    local_c8[lVar6] = iVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  pMVar5 = Mio_CollectRootsNewDefault2(6,&p->nCells,fVerbose);
  p->pCells = pMVar5;
  if (2 < p->nCells) {
    lVar7 = 2;
    lVar6 = 0xd0;
    do {
      Nf_StoCreateGateMaches
                (p,(Mio_Cell2_t *)((long)p->pCells->Delays + lVar6 + -0x30),local_68,local_a8,
                 local_c8,p_00,vStore);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x68;
    } while (lVar7 < p->nCells);
  }
  lVar6 = 1;
  do {
    if (local_68[lVar6] != (int *)0x0) {
      free(local_68[lVar6]);
      local_68[lVar6] = (int *)0x0;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  lVar6 = 1;
  do {
    if (local_a8[lVar6] != (int *)0x0) {
      free(local_a8[lVar6]);
      local_a8[lVar6] = (int *)0x0;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  iVar1 = p_00->nCap;
  if (0 < (long)iVar1) {
    pVVar2 = p_00->pArray;
    lVar6 = 0;
    do {
      __ptr = *(void **)((long)&pVVar2->pArray + lVar6);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar2->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar6);
  }
  if (p_00->pArray != (Vec_Int_t *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (Vec_Int_t *)0x0;
  }
  p_00->nCap = 0;
  p_00->nSize = 0;
  free(p_00);
  if (vStore->pArray != (word *)0x0) {
    free(vStore->pArray);
    vStore->pArray = (word *)0x0;
  }
  free(vStore);
  return;
}

Assistant:

void Nf_StoDeriveMatches( Nf_Man_t * p, int fVerbose )
{
//    abctime clk = Abc_Clock();
    Vec_Wec_t * vProfs = Vec_WecAlloc( 1000 );
    Vec_Wrd_t * vStore = Vec_WrdAlloc( 10000 );
    int * pComp[7], * pPerm[7], nPerms[7], i;
    Vec_WecPushLevel( vProfs );
    Vec_WecPushLevel( vProfs );
    for ( i = 1; i <= 6; i++ )
        pComp[i] = Extra_GreyCodeSchedule( i );
    for ( i = 1; i <= 6; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 1; i <= 6; i++ )
        nPerms[i] = Extra_Factorial( i );
    p->pCells = Mio_CollectRootsNewDefault2( 6, &p->nCells, fVerbose );
    for ( i = 2; i < p->nCells; i++ )
        Nf_StoCreateGateMaches( p, p->pCells + i, pComp, pPerm, nPerms, vProfs, vStore );
    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pComp[i] );
    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pPerm[i] );
    Vec_WecFree( vProfs );
    Vec_WrdFree( vStore );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}